

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void sha512_final(sha512 *ctx,uint8_t *out)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  
  sVar2 = ctx->fill;
  ctx->fill = sVar2 + 1;
  ctx->buffer[sVar2] = 0x80;
  uVar3 = ctx->fill;
  if (uVar3 < 0x71) {
    if (uVar3 == 0x70) goto LAB_001018c2;
  }
  else {
    if (uVar3 < 0x80) {
      do {
        uVar1 = uVar3 + 1;
        ctx->fill = uVar1;
        ctx->buffer[uVar3] = '\0';
        uVar3 = uVar1;
      } while (uVar1 != 0x80);
    }
    compress(ctx->state,ctx->buffer);
    uVar3 = 0;
  }
  do {
    uVar1 = uVar3 + 1;
    ctx->fill = uVar1;
    ctx->buffer[uVar3] = '\0';
    uVar3 = uVar1;
  } while (uVar1 != 0x70);
LAB_001018c2:
  uVar3 = ctx->count;
  ctx->buffer[0x70] = '\0';
  ctx->buffer[0x71] = '\0';
  ctx->buffer[0x72] = '\0';
  ctx->buffer[0x73] = '\0';
  ctx->buffer[0x74] = '\0';
  ctx->buffer[0x75] = '\0';
  ctx->buffer[0x76] = (byte)(uVar3 >> 0x3e);
  ctx->buffer[0x77] = (uint8_t)(uVar3 >> 0x36);
  uVar3 = uVar3 << 10 | sVar2 << 3;
  ctx->buffer[0x78] = (uint8_t)(uVar3 >> 0x38);
  ctx->buffer[0x79] = (uint8_t)(uVar3 >> 0x30);
  ctx->buffer[0x7a] = (uint8_t)(uVar3 >> 0x28);
  ctx->buffer[0x7b] = (uint8_t)(uVar3 >> 0x20);
  ctx->buffer[0x7c] = (uint8_t)(uVar3 >> 0x18);
  ctx->buffer[0x7d] = (uint8_t)(uVar3 >> 0x10);
  ctx->buffer[0x7e] = (uint8_t)(uVar3 >> 8);
  ctx->buffer[0x7f] = (uint8_t)(sVar2 << 3);
  compress(ctx->state,ctx->buffer);
  lVar4 = 0;
  do {
    uVar3 = ctx->state[lVar4];
    *(ulong *)(out + lVar4 * 8) =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  return;
}

Assistant:

void
sha512_final(struct sha512 *ctx, uint8_t out[SHA512_HASH_LENGTH])
{
	size_t rest;
	int i;

	rest = ctx->fill;
	
	/* append 1-bit to signal end of data */
	ctx->buffer[ctx->fill++] = 0x80;
	
	if (ctx->fill > SHA512_BLOCK_SIZE - 16) {
		while (ctx->fill < SHA512_BLOCK_SIZE)
			ctx->buffer[ctx->fill++] = 0;

		compress(ctx->state, ctx->buffer);
		ctx->fill = 0;
	}
	while (ctx->fill < SHA512_BLOCK_SIZE - 16)
		ctx->buffer[ctx->fill++] = 0;

	/* because rest < 128 our message length is
	 * L := 128*ctx->count + rest == (ctx->count<<7)|rest,
	 * now convert L to number of bits and write out as 128bit big-endian.
	 */
	store_be64(ctx->buffer+SHA512_BLOCK_SIZE-16,
			ctx->count >> 54);
	store_be64(ctx->buffer+SHA512_BLOCK_SIZE-8,
			((ctx->count << 7) | rest) << 3);
	
	compress(ctx->state, ctx->buffer);


	for (i = 0; i < 8; i++)
		store_be64(out + 8*i, ctx->state[i]);
}